

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

int re2::RE2::GlobalReplace(string *str,RE2 *re,StringPiece *rewrite)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Rune RVar4;
  int iVar5;
  long lVar6;
  pointer pcVar7;
  pointer __s;
  char *local_188;
  Rune r;
  undefined4 uStack_17c;
  size_t local_178;
  string out;
  StringPiece vec [17];
  
  memset(vec,0,0x110);
  uVar2 = MaxSubmatch(rewrite);
  if ((0x10 < uVar2) || (re->num_captures_ < (int)uVar2)) {
    return 0;
  }
  __s = (str->_M_dataplus)._M_p;
  pcVar7 = __s + str->_M_string_length;
  out._M_dataplus._M_p = (pointer)&out.field_2;
  out._M_string_length = 0;
  out.field_2._M_local_buf[0] = '\0';
  local_188 = (char *)0x0;
  iVar5 = 0;
  while ((__s <= pcVar7 &&
         (iVar5 < maximum_global_replace_count || maximum_global_replace_count == -1))) {
    _r = (str->_M_dataplus)._M_p;
    local_178 = str->_M_string_length;
    bVar1 = Match(re,(StringPiece *)&r,(long)__s - (long)_r,local_178,UNANCHORED,vec,uVar2 + 1);
    if (!bVar1) break;
    if (__s < vec[0].data_) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&out,__s,(long)vec[0].data_ - (long)__s);
    }
    if ((vec[0].data_ == local_188) && (vec[0].size_ == 0)) {
      if ((re->options_).encoding_ == EncodingUTF8) {
        lVar6 = (long)pcVar7 - (long)__s;
        if (3 < (long)pcVar7 - (long)__s) {
          lVar6 = 4;
        }
        iVar3 = fullrune(__s,(int)lVar6);
        if (iVar3 == 0) goto LAB_001ca391;
        iVar3 = chartorune(&r,__s);
        RVar4 = r;
        if (0x10ffff < r) {
          _r = (pointer)CONCAT44(uStack_17c,0xfffd);
          RVar4 = 0xfffd;
          iVar3 = 1;
        }
        if (RVar4 == 0xfffd && iVar3 == 1) goto LAB_001ca391;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&out,__s,(long)iVar3);
        __s = __s + iVar3;
      }
      else {
LAB_001ca391:
        if (__s < pcVar7) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append(&out,__s,1);
        }
        __s = __s + 1;
      }
    }
    else {
      Rewrite(re,&out,rewrite,vec,uVar2 + 1);
      __s = vec[0].data_ + vec[0].size_;
      iVar5 = iVar5 + 1;
      local_188 = __s;
    }
  }
  if (iVar5 != 0) {
    if (__s < pcVar7) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&out,__s,(long)pcVar7 - (long)__s);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
              (&out,str);
  }
  std::__cxx11::string::~string((string *)&out);
  return iVar5;
}

Assistant:

int RE2::GlobalReplace(std::string* str,
                       const RE2& re,
                       const StringPiece& rewrite) {
  StringPiece vec[kVecSize];
  int nvec = 1 + MaxSubmatch(rewrite);
  if (nvec > 1 + re.NumberOfCapturingGroups())
    return false;
  if (nvec > static_cast<int>(arraysize(vec)))
    return false;

  const char* p = str->data();
  const char* ep = p + str->size();
  const char* lastend = NULL;
  std::string out;
  int count = 0;
  while (p <= ep) {
    if (maximum_global_replace_count != -1 &&
        count >= maximum_global_replace_count)
      break;
    if (!re.Match(*str, static_cast<size_t>(p - str->data()),
                  str->size(), UNANCHORED, vec, nvec))
      break;
    if (p < vec[0].data())
      out.append(p, vec[0].data() - p);
    if (vec[0].data() == lastend && vec[0].empty()) {
      // Disallow empty match at end of last match: skip ahead.
      //
      // fullrune() takes int, not ptrdiff_t. However, it just looks
      // at the leading byte and treats any length >= 4 the same.
      if (re.options().encoding() == RE2::Options::EncodingUTF8 &&
          fullrune(p, static_cast<int>(std::min(ptrdiff_t{4}, ep - p)))) {
        // re is in UTF-8 mode and there is enough left of str
        // to allow us to advance by up to UTFmax bytes.
        Rune r;
        int n = chartorune(&r, p);
        // Some copies of chartorune have a bug that accepts
        // encodings of values in (10FFFF, 1FFFFF] as valid.
        if (r > Runemax) {
          n = 1;
          r = Runeerror;
        }
        if (!(n == 1 && r == Runeerror)) {  // no decoding error
          out.append(p, n);
          p += n;
          continue;
        }
      }
      // Most likely, re is in Latin-1 mode. If it is in UTF-8 mode,
      // we fell through from above and the GIGO principle applies.
      if (p < ep)
        out.append(p, 1);
      p++;
      continue;
    }
    re.Rewrite(&out, rewrite, vec, nvec);
    p = vec[0].data() + vec[0].size();
    lastend = p;
    count++;
  }

  if (count == 0)
    return 0;

  if (p < ep)
    out.append(p, ep - p);
  using std::swap;
  swap(out, *str);
  return count;
}